

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O1

void __thiscall amrex::ParmParse::PP_entry::~PP_entry(PP_entry *this)

{
  _List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *this_00;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this_00 = &this->m_table->
             super__List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
  ;
  if (this_00 !=
      (_List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)0x0) {
    std::__cxx11::
    _List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::_M_clear
              (this_00);
    operator_delete(this_00,0x18);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_vals);
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  paVar2 = &(this->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

ParmParse::PP_entry::~PP_entry ()
{
    delete m_table;
}